

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ResultValueBase<Catch::Clara::Detail::ParseState> * __thiscall
Catch::Clara::Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::operator=
          (ResultValueBase<Catch::Clara::Detail::ParseState> *this,
          ResultValueBase<Catch::Clara::Detail::ParseState> *other)

{
  ResultType RVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if ((this->super_ResultBase).m_type == Ok) {
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
              (&(this->field_0).m_value.m_remainingTokens.m_tokenBuffer);
  }
  RVar1 = (other->super_ResultBase).m_type;
  (this->super_ResultBase).m_type = RVar1;
  if (RVar1 == Ok) {
    (this->field_0).m_value.m_type = (other->field_0).m_value.m_type;
    pbVar2 = (other->field_0).m_value.m_remainingTokens.itEnd._M_current;
    (this->field_0).m_value.m_remainingTokens.it._M_current =
         (other->field_0).m_value.m_remainingTokens.it._M_current;
    (this->field_0).m_value.m_remainingTokens.itEnd._M_current = pbVar2;
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
              (&(this->field_0).m_value.m_remainingTokens.m_tokenBuffer,
               &(other->field_0).m_value.m_remainingTokens.m_tokenBuffer);
  }
  return this;
}

Assistant:

auto operator=( ResultValueBase const& other )
                    -> ResultValueBase& {
                    if ( m_type == ResultType::Ok )
                        m_value.~T();
                    ResultBase::operator=( other );
                    if ( m_type == ResultType::Ok )
                        new ( &m_value ) T( other.m_value );
                    return *this;
                }